

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall foxxll::disk_config::parse_line(disk_config *this,string *line)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  ulong uVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmfield;
  int pid;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eqfield;
  ostringstream msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  __pid_t local_1d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  string local_198 [11];
  
  tlx::split(&local_1b0,'=',line,2,2);
  iVar2 = std::__cxx11::string::compare
                    ((char *)local_1b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((char *)local_1b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    bVar1 = true;
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Error in ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"void foxxll::disk_config::parse_line(const std::string &)",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," : ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Unknown configuration token ",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,
                 ((local_1b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                 (local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)local_1d0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this->flash = bVar1;
  this->autogrow = true;
  this->delete_on_exit = false;
  this->direct = DIRECT_TRY;
  this->queue = -1;
  this->device_id = 0xffffffff;
  this->unlink_on_open = false;
  tlx::split(&local_1e8,',',
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,3,3);
  tlx::expand_environment_variables
            (local_198,
             local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::operator=((string *)this,(string *)local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  uVar4 = std::__cxx11::string::find((char *)this,0x155241,0);
  if (uVar4 != 0xffffffffffffffff) {
    local_1d0[0] = getpid();
    to_str<int>(local_198,local_1d0);
    std::__cxx11::string::replace
              ((ulong)this,uVar4,(char *)0x3,(ulong)local_198[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
      operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = tlx::parse_si_iec_units
                    (local_1e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,&this->size,'M');
  if (bVar1) {
    if (this->size == 0) {
      this->autogrow = true;
      this->delete_on_exit = true;
    }
    std::__cxx11::string::_M_assign((string *)&this->io_impl);
    parse_fileio(this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b0);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Error in ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"void foxxll::disk_config::parse_line(const std::string &)",0x39);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Invalid disk size \'",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,
                      local_1e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                      local_1e8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' in disk configuration file.",0x1d);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)local_1d0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void disk_config::parse_line(const std::string& line)
{
    // split off disk= or flash=
    std::vector<std::string> eqfield = tlx::split('=', line, 2, 2);

    if (eqfield[0] == "disk") {
        flash = false;
    }
    else if (eqfield[0] == "flash") {
        flash = true;
    }
    else {
        FOXXLL_THROW(
            std::runtime_error,
            "Unknown configuration token " << eqfield[0]
        );
    }

    // *** Set Default Extra Options ***

    autogrow = true; // was default for a long time, have to keep it this way
    delete_on_exit = false;
    direct = DIRECT_TRY;
    // flash is already set
    queue = file::DEFAULT_QUEUE;
    device_id = file::DEFAULT_DEVICE_ID;
    unlink_on_open = false;

    // *** Save Basic Options ***

    // split at commands, at least 3 fields
    std::vector<std::string> cmfield = tlx::split(',', eqfield[1], 3, 3);

    // path:
    path = tlx::expand_environment_variables(cmfield[0]);
    // replace $$ -> pid in path
    {
        std::string::size_type pos;
        if ((pos = path.find("$$")) != std::string::npos)
        {
#if !FOXXLL_WINDOWS
            int pid = getpid();
#else
            DWORD pid = GetCurrentProcessId();
#endif
            path.replace(pos, 3, to_str(pid));
        }
    }

    // size: (default unit MiB)
    if (!tlx::parse_si_iec_units(cmfield[1], &size, 'M')) {
        FOXXLL_THROW(
            std::runtime_error,
            "Invalid disk size '" << cmfield[1] << "' in disk configuration file."
        );
    }

    if (size == 0) {
        autogrow = true;
        delete_on_exit = true;
    }

    // io_impl:
    io_impl = cmfield[2];
    parse_fileio();
}